

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.H
# Opt level: O0

void __thiscall
amrex::ParmParse::get<double,3ul>(ParmParse *this,char *name,array<double,_3UL> *ref)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  ParmParse *unaff_retaddr;
  size_t i;
  vector<double,_std::allocator<double>_> v;
  char *in_stack_00000198;
  int in_stack_000001a4;
  char *in_stack_000001a8;
  char *in_stack_000001b0;
  size_type in_stack_ffffffffffffff78;
  array<double,_3UL> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  ulong local_68;
  vector<double,_std::allocator<double>_> local_50 [2];
  undefined8 local_20;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffff0;
  char *in_stack_fffffffffffffff8;
  
  this_01 = local_50;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x11994cf);
  getarr(unaff_retaddr,in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec
         ,in_stack_ffffffffffffffe8);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(local_50);
  if (sVar1 < 3) {
    local_20 = 0;
    Assert_host(in_stack_000001b0,in_stack_000001a8,in_stack_000001a4,in_stack_00000198);
  }
  for (local_68 = 0; local_68 < 3; local_68 = local_68 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_50,local_68);
    this_00 = (array<double,_3UL> *)*pvVar2;
    pvVar3 = std::array<double,_3UL>::operator[](this_00,in_stack_ffffffffffffff78);
    *pvVar3 = (value_type_conflict1)this_00;
  }
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  return;
}

Assistant:

void get (const char* name, std::array<T,N>& ref) const {
        std::vector<T> v;
        this->getarr(name, v);
        AMREX_ALWAYS_ASSERT(v.size() >= N);
        for (std::size_t i = 0; i < N; ++i) {
            ref[i] = v[i];
        }
    }